

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O0

bool __thiscall
TPZAutoPointer<TPZDohrAssembly<long_double>_>::TPZReference::Decrease(TPZReference *this)

{
  int iVar1;
  int *piVar2;
  logic_error *this_00;
  long in_RDI;
  int result;
  bool should_delete;
  bool local_21;
  
  local_21 = false;
  piVar2 = (int *)(in_RDI + 8);
  LOCK();
  iVar1 = *piVar2;
  *piVar2 = *piVar2 + -1;
  UNLOCK();
  if (iVar1 == 1) {
    local_21 = true;
  }
  else if (iVar1 + -1 < 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Invalid value for ref counter of TPZAutoPointer");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return local_21;
}

Assistant:

bool Decrease()
        {
            bool should_delete = false;
            int result = fCounter.fetch_sub(1);
            result--;
//            std::this_thread::sleep_for(std::chrono::milliseconds(10));
            // at this point the object may already have been deleted by another thread
//            {
//                const std::lock_guard<std::mutex> lock(pzinternal::g_diag_mut);
//                std::cout <<  "thread id " <<  std::this_thread::get_id() <<
//                " result " << result << std::endl;
//            }
            if((result) == 0) should_delete = true;
            else if((result) < 0){
                throw std::logic_error(
                    "Invalid value for ref counter of TPZAutoPointer");
            }
            return should_delete;
        }